

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash_test.cc
# Opt level: O2

int main(void)

{
  unsigned_long_long __val;
  uint __line;
  __type _Var1;
  __pid_t _Var2;
  RetCode RVar3;
  int iVar4;
  char *__assertion;
  string *psVar5;
  string *this;
  long lVar6;
  int res;
  allocator local_b1;
  string local_b0;
  string value;
  string engine_path;
  Engine *engine;
  
  std::__cxx11::string::string
            ((string *)&engine_path,
             "======================= crash test ============================",(allocator *)&value);
  printf_(&engine_path);
  std::__cxx11::string::~string((string *)&engine_path);
  std::__cxx11::string::string((string *)&value,"./data/test-",(allocator *)&engine);
  __val = rdtsc();
  std::__cxx11::to_string(&local_b0,__val);
  std::operator+(&engine_path,&value,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&value);
  printf("open engine_path: %s\n",engine_path._M_dataplus._M_p);
  psVar5 = vs_abi_cxx11_;
  this = ks_abi_cxx11_;
  for (lVar6 = 0; lVar6 != 30000; lVar6 = lVar6 + 1) {
    gen_random(k,0xd);
    std::__cxx11::string::string((string *)&local_b0,k,(allocator *)&res);
    std::__cxx11::to_string((string *)&engine,(int)lVar6);
    std::operator+(&value,&local_b0,(string *)&engine);
    std::__cxx11::string::operator=((string *)this,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&engine);
    std::__cxx11::string::~string((string *)&local_b0);
    gen_random(v,0x2a5);
    std::__cxx11::string::assign((char *)psVar5);
    psVar5 = psVar5 + 1;
    this = this + 1;
  }
  signal(10,handler);
  _Var2 = fork();
  if (_Var2 == 0) {
    engine = (Engine *)0x0;
    RVar3 = polar_race::Engine::Open(&engine_path,&engine);
    if (RVar3 == kSucc) {
      for (lVar6 = 8; lVar6 != 0xea608; lVar6 = lVar6 + 0x20) {
        value._M_dataplus._M_p = *(pointer *)(v + lVar6 + 0x2338);
        value._M_string_length = *(size_type *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
        local_b0._M_dataplus._M_p = *(pointer *)((long)&ks_abi_cxx11_[29999].field_2 + lVar6 + 8);
        local_b0._M_string_length = *(size_type *)((long)&vs_abi_cxx11_[0]._M_dataplus._M_p + lVar6)
        ;
        iVar4 = (*engine->_vptr_Engine[2])(engine,&value,&local_b0);
        if (iVar4 != 0) {
          __assertion = "ret == kSucc";
          __line = 0x35;
          goto LAB_00103929;
        }
        if (lVar6 == 0x4e208) {
          _Var2 = getppid();
          kill(_Var2,10);
        }
      }
      if (engine != (Engine *)0x0) {
        (*engine->_vptr_Engine[1])();
      }
LAB_001038a9:
      std::__cxx11::string::~string((string *)&engine_path);
      return 0;
    }
    __assertion = "ret == kSucc";
    __line = 0x32;
  }
  else if (_Var2 < 1) {
    __assertion = "false";
    __line = 99;
  }
  else {
    do {
    } while (need_kill != true);
    res = kill(_Var2,9);
    if (res == 0) {
      waitpid(_Var2,&res,0);
      if (res < 1) {
        __assertion = "res > 0";
        __line = 0x44;
      }
      else {
        engine = (Engine *)0x0;
        RVar3 = polar_race::Engine::Open(&engine_path,&engine);
        if (RVar3 == kSucc) {
          value._M_dataplus._M_p = (pointer)&value.field_2;
          value._M_string_length = 0;
          value.field_2._M_local_buf[0] = '\0';
          lVar6 = 0;
          do {
            if (lVar6 + 0x20 == 0x4e240) {
              lVar6 = 0x4e228;
              goto LAB_0010371e;
            }
            local_b0._M_dataplus._M_p =
                 *(pointer *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
            local_b0._M_string_length =
                 *(size_type *)((long)&ks_abi_cxx11_[0]._M_string_length + lVar6);
            iVar4 = (*engine->_vptr_Engine[3])(engine,&local_b0,&value);
            if (iVar4 != 0) {
              __assertion = "ret == kSucc";
              __line = 0x4f;
              goto LAB_00103929;
            }
            _Var1 = std::operator==(&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&vs_abi_cxx11_[0]._M_dataplus._M_p + lVar6));
            lVar6 = lVar6 + 0x20;
          } while (_Var1);
          __assertion = "value == vs[i]";
          __line = 0x50;
        }
        else {
          __assertion = "ret == kSucc";
          __line = 0x49;
        }
      }
    }
    else {
      __assertion = "res == 0";
      __line = 0x41;
    }
  }
  goto LAB_00103929;
LAB_0010371e:
  if (lVar6 == 0xea608) goto LAB_0010381c;
  local_b0._M_dataplus._M_p = *(pointer *)(v + lVar6 + 0x2338);
  local_b0._M_string_length = *(size_type *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
  iVar4 = (*engine->_vptr_Engine[3])(engine,&local_b0,&value);
  if (iVar4 != 0) {
    if (iVar4 != 1) {
      __assertion = "ret == kNotFound";
      __line = 0x57;
      goto LAB_00103929;
    }
    goto LAB_0010381c;
  }
  _Var1 = std::operator==(&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&ks_abi_cxx11_[29999].field_2 + lVar6 + 8));
  if (!_Var1) {
    __assertion = "value == vs[i]";
    __line = 0x55;
    goto LAB_00103929;
  }
  lVar6 = lVar6 + 0x20;
  goto LAB_0010371e;
LAB_0010381c:
  do {
    if (lVar6 + 0x20 == 0xea628) {
      std::__cxx11::string::string
                ((string *)&local_b0,
                 "======================= crash test pass :) ======================",&local_b1);
      printf_(&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&value);
      goto LAB_001038a9;
    }
    local_b0._M_dataplus._M_p = *(pointer *)(v + lVar6 + 0x2338);
    local_b0._M_string_length = *(size_type *)((long)&ks_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
    iVar4 = (*engine->_vptr_Engine[3])(engine,&local_b0,&value);
    lVar6 = lVar6 + 0x20;
  } while (iVar4 == 1);
  __assertion = "ret == kNotFound";
  __line = 0x5e;
LAB_00103929:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {

    printf_( "======================= crash test ============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int i = 0; i < KV_CNT; ++i) {
        gen_random(k, 13);
        ks[i] = std::string(k) + std::to_string(i);
        gen_random(v, 677);
        vs[i] = v;
    }

    signal(SIGUSR1, handler);
    pid_t fpid = fork();
    if (fpid == 0) { // child
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        for (int i = 0; i < KV_CNT; ++i) {
            RetCode ret = engine->Write(ks[i], vs[i]);
            assert(ret == kSucc);
            if (i == KV_CNT / 3) {
                kill(getppid(), SIGUSR1);
            }
        }
        delete engine;

    } else if (fpid > 0) { // me

        while (!need_kill);

        int res = kill(fpid, 9);
        assert(res == 0);
        
        waitpid(fpid, &res, 0);
        assert(res > 0);

        // re-open and check 
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        std::string value;

        int i = 0;
        for (; i <= KV_CNT / 3; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kSucc);
            assert(value == vs[i]);
        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            if (ret == kSucc) {
                assert(value == vs[i]);
            } else {
                assert(ret == kNotFound);
                break;
            }

        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kNotFound);
        }
        printf_( "======================= crash test pass :) " "======================");

    } else {
        assert(false);
    }

    return 0;
}